

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::
Combine<ktx::OptionsCreate,_ktx::OptionsEncodeASTC,_ktx::OptionsEncodeBasis<false>,_ktx::OptionsEncodeCommon,_ktx::OptionsMetrics,_ktx::OptionsDeflate,_ktx::OptionsMultiInSingleOut,_ktx::OptionsGeneric>
::Combine(Combine<ktx::OptionsCreate,_ktx::OptionsEncodeASTC,_ktx::OptionsEncodeBasis<false>,_ktx::OptionsEncodeCommon,_ktx::OptionsMetrics,_ktx::OptionsDeflate,_ktx::OptionsMultiInSingleOut,_ktx::OptionsGeneric>
          *this)

{
  OptionsMultiInSingleOut *in_RDI;
  OptionsEncodeASTC *unaff_retaddr;
  OptionsCreate *in_stack_00000010;
  OptionsEncodeBasis<false> *in_stack_00000030;
  
  OptionsCreate::OptionsCreate(in_stack_00000010);
  OptionsEncodeASTC::OptionsEncodeASTC(unaff_retaddr);
  OptionsEncodeBasis<false>::OptionsEncodeBasis(in_stack_00000030);
  OptionsEncodeCommon::OptionsEncodeCommon((OptionsEncodeCommon *)in_RDI);
  OptionsDeflate::OptionsDeflate((OptionsDeflate *)in_RDI);
  OptionsMultiInSingleOut::OptionsMultiInSingleOut(in_RDI);
  OptionsGeneric::OptionsGeneric
            ((OptionsGeneric *)
             &in_RDI[0x10].inputFilepaths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void init(cxxopts::Options& opts) {
        (Args::init(opts), ...);
    }